

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

BrandArgumentList * __thiscall
capnp::Schema::getBrandArgumentsAtScope
          (BrandArgumentList *__return_storage_ptr__,Schema *this,uint64_t scopeId)

{
  RawBrandedSchema *pRVar1;
  Scope *pSVar2;
  bool bVar3;
  Binding *pBVar4;
  uint uVar5;
  long lVar6;
  Fault f;
  ArrayPtr<const_char> local_60;
  Reader local_50;
  
  getProto(&local_50,this);
  if ((local_50._reader.dataSize < 0x121) ||
     ((*(byte *)((long)local_50._reader.data + 0x24) & 1) == 0)) {
    getProto(&local_50,this);
    local_60 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_50);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],capnp::Text::Reader>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0xfa,FAILED,"getProto().getIsGeneric()",
               "\"Not a generic type.\", getProto().getDisplayName()",
               (char (*) [20])"Not a generic type.",(Reader *)&local_60);
    kj::_::Debug::Fault::fatal(&f);
  }
  pRVar1 = this->raw;
  pSVar2 = pRVar1->scopes;
  lVar6 = 0;
  do {
    if ((ulong)pRVar1->scopeCount * 0x18 - lVar6 == 0) {
      bVar3 = &pRVar1->generic->defaultBrand != pRVar1 && pRVar1->scopeCount == 0;
LAB_00246cff:
      uVar5 = 0;
      pBVar4 = (Binding *)0x0;
LAB_00246d10:
      __return_storage_ptr__->scopeId = scopeId;
      __return_storage_ptr__->size_ = uVar5;
      __return_storage_ptr__->isUnbound = bVar3;
      __return_storage_ptr__->bindings = pBVar4;
      return __return_storage_ptr__;
    }
    if (*(uint64_t *)((long)&pSVar2->typeId + lVar6) == scopeId) {
      if ((&pSVar2->isUnbound)[lVar6] != false) {
        bVar3 = true;
        goto LAB_00246cff;
      }
      uVar5 = *(uint *)((long)&pSVar2->bindingCount + lVar6);
      pBVar4 = *(Binding **)((long)&pSVar2->bindings + lVar6);
      bVar3 = false;
      goto LAB_00246d10;
    }
    lVar6 = lVar6 + 0x18;
  } while( true );
}

Assistant:

Schema::BrandArgumentList Schema::getBrandArgumentsAtScope(uint64_t scopeId) const {
  KJ_REQUIRE(getProto().getIsGeneric(), "Not a generic type.", getProto().getDisplayName());

  for (auto scope: kj::range(raw->scopes, raw->scopes + raw->scopeCount)) {
    if (scope->typeId == scopeId) {
      // OK, this scope matches the scope we're looking for.
      if (scope->isUnbound) {
        return BrandArgumentList(scopeId, true);
      } else {
        return BrandArgumentList(scopeId, scope->bindingCount, scope->bindings);
      }
    }
  }

  // This scope is not listed in the scopes list.
  return BrandArgumentList(scopeId, raw->isUnbound());
}